

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::ParseServiceDefinition
          (Parser *this,ServiceDescriptorProto *service,LocationRecorder *service_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  string *output;
  Arena *arena;
  string_view text;
  LocationRecorder location;
  LocationRecorder LStack_48;
  
  text._M_str = "service";
  text._M_len = 7;
  bVar1 = Consume(this,text);
  if (bVar1) {
    LocationRecorder::Init(&LStack_48,service_location,service_location->source_code_info_);
    RepeatedField<int>::Add(&((LStack_48.location_)->field_0)._impl_.path_,1);
    LocationRecorder::RecordLegacyLocation(&LStack_48,&service->super_Message,NAME);
    *(byte *)&service->field_0 = *(byte *)&service->field_0 | 1;
    arena = (Arena *)(service->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    output = protobuf::internal::ArenaStringPtr::Mutable_abi_cxx11_
                       (&(service->field_0)._impl_.name_,arena);
    bVar1 = ConsumeIdentifier(this,output,(ErrorMaker)ZEXT816(0x643649));
    LocationRecorder::~LocationRecorder(&LStack_48);
    if (bVar1) {
      bVar1 = ParseServiceBlock(this,service,service_location,containing_file);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool Parser::ParseServiceDefinition(
    ServiceDescriptorProto* service, const LocationRecorder& service_location,
    const FileDescriptorProto* containing_file) {
  DO(Consume("service"));

  {
    LocationRecorder location(service_location,
                              ServiceDescriptorProto::kNameFieldNumber);
    location.RecordLegacyLocation(service,
                                  DescriptorPool::ErrorCollector::NAME);
    DO(ConsumeIdentifier(service->mutable_name(), "Expected service name."));
  }

  DO(ParseServiceBlock(service, service_location, containing_file));
  return true;
}